

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Txa.cpp
# Opt level: O2

int processTxa(istream *in,path *output)

{
  pointer pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  pointer pTVar2;
  Image currentChunk;
  Image local_210;
  TxaHeader header;
  string outTemplate;
  path outputDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  path outFilename;
  string outName;
  ThreadedImageSaver saver;
  path local_80;
  path local_58;
  
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::stem((path *)&saver,output);
  std::filesystem::__cxx11::path::string(&outTemplate,(path *)&saver);
  std::filesystem::__cxx11::path::~path((path *)&saver);
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator>>(in,&header);
  ThreadedImageSaver::ThreadedImageSaver(&saver);
  pTVar1 = header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = header.chunks.super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    std::operator+(&outFilename._M_pathname,&outTemplate,"_");
    std::operator+(&outName,&outFilename._M_pathname,&pTVar2->name);
    std::__cxx11::string::~string((string *)&outFilename);
    Image::Image(&currentChunk,(Size)0x0,(Color)0x0);
    processChunkNoHeader
              (&currentChunk,pTVar2->offset,pTVar2->length,header.indexed,(uint)pTVar2->width,
               (uint)pTVar2->height,in,&outName,header.isSwitch);
    std::operator+(&local_178,&outName,".png");
    std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
              (&local_58,(__cxx11 *)&local_178,__source);
    std::filesystem::__cxx11::operator/(&outFilename,&outputDir,&local_58);
    std::filesystem::__cxx11::path::~path(&local_58);
    std::__cxx11::string::~string((string *)&local_178);
    local_210.size = currentChunk.size;
    local_210.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_start =
         currentChunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_210.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_finish =
         currentChunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_210.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         currentChunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    currentChunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    currentChunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    currentChunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::filesystem::__cxx11::path::path(&local_80,&outFilename);
    ThreadedImageSaver::enqueue(&saver,&local_210,&local_80);
    std::filesystem::__cxx11::path::~path(&local_80);
    std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
              (&local_210.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
    std::filesystem::__cxx11::path::~path(&outFilename);
    std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
              (&currentChunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
    std::__cxx11::string::~string((string *)&outName);
  }
  ThreadedImageSaver::~ThreadedImageSaver(&saver);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::~vector(&header.chunks);
  std::__cxx11::string::~string((string *)&outTemplate);
  std::filesystem::__cxx11::path::~path(&outputDir);
  return 0;
}

Assistant:

int processTxa(std::istream &in, const fs::path &output) {
	fs::path outputDir = output.parent_path();
	std::string outTemplate = output.stem().string();

	TxaHeader header;
	in >> header;

#if ENABLE_MULTITHREADED
	ThreadedImageSaver saver;
#endif

	for (const auto& chunk : header.chunks) {
		std::string outName = outTemplate + "_" + chunk.name;
		Image currentChunk({0, 0});
		processChunkNoHeader(currentChunk, chunk.offset, chunk.length, header.indexed, chunk.width, chunk.height, in, outName, header.isSwitch);

		auto outFilename = outputDir/fs::u8path(outName + ".png");
#if ENABLE_MULTITHREADED
		saver.enqueue(std::move(currentChunk), std::move(outFilename));
#else
		currentChunk.writePNG(outFilename);
#endif
	}
	return 0;
}